

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_d9f85c::Toolchains::DumpToolchainVariables
          (Value *__return_storage_ptr__,Toolchains *this,cmMakefile *mf,string *lang,
          vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
          *variables)

{
  bool bVar1;
  reference variable_00;
  ToolchainVariable *variable;
  const_iterator __end1;
  const_iterator __begin1;
  vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
  *__range1;
  vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
  *variables_local;
  string *lang_local;
  cmMakefile *mf_local;
  Toolchains *this_local;
  Value *object;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  __end1 = std::
           vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
           ::begin(variables);
  variable = (ToolchainVariable *)
             std::
             vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
             ::end(variables);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_(anonymous_namespace)::ToolchainVariable_*,_std::vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>_>
                                     *)&variable), bVar1) {
    variable_00 = __gnu_cxx::
                  __normal_iterator<const_(anonymous_namespace)::ToolchainVariable_*,_std::vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>_>
                  ::operator*(&__end1);
    DumpToolchainVariable(this,mf,__return_storage_ptr__,lang,variable_00);
    __gnu_cxx::
    __normal_iterator<const_(anonymous_namespace)::ToolchainVariable_*,_std::vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Toolchains::DumpToolchainVariables(
  cmMakefile const* mf, std::string const& lang,
  std::vector<ToolchainVariable> const& variables)
{
  Json::Value object = Json::objectValue;
  for (const auto& variable : variables) {
    this->DumpToolchainVariable(mf, object, lang, variable);
  }
  return object;
}